

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_tRNS(ucvector *out,LodePNGColorMode *info)

{
  uint uVar1;
  uint error_2;
  uint error_1;
  uint error;
  size_t amount;
  size_t i;
  uchar *chunk;
  LodePNGColorMode *info_local;
  ucvector *out_local;
  
  i = 0;
  chunk = (uchar *)info;
  info_local = (LodePNGColorMode *)out;
  if (info->colortype == LCT_PALETTE) {
    _error_1 = info->palettesize;
    amount = info->palettesize;
    while ((amount != 0 && (info->palette[(amount - 1) * 4 + 3] == 0xff))) {
      _error_1 = _error_1 - 1;
      amount = amount - 1;
    }
    if (_error_1 != 0) {
      uVar1 = lodepng_chunk_init((uchar **)&i,out,_error_1,"tRNS");
      if (uVar1 != 0) {
        return uVar1;
      }
      for (amount = 0; amount != _error_1; amount = amount + 1) {
        *(undefined1 *)(i + amount + 8) = *(undefined1 *)(*(long *)(chunk + 8) + 3 + amount * 4);
      }
    }
  }
  else if (info->colortype == LCT_GREY) {
    if (info->key_defined != 0) {
      uVar1 = lodepng_chunk_init((uchar **)&i,out,2,"tRNS");
      if (uVar1 != 0) {
        return uVar1;
      }
      *(char *)(i + 8) = (char)((uint)*(undefined4 *)(chunk + 0x1c) >> 8);
      *(char *)(i + 9) = (char)*(undefined4 *)(chunk + 0x1c);
    }
  }
  else if ((info->colortype == LCT_RGB) && (info->key_defined != 0)) {
    uVar1 = lodepng_chunk_init((uchar **)&i,out,6,"tRNS");
    if (uVar1 != 0) {
      return uVar1;
    }
    *(char *)(i + 8) = (char)((uint)*(undefined4 *)(chunk + 0x1c) >> 8);
    *(char *)(i + 9) = (char)*(undefined4 *)(chunk + 0x1c);
    *(char *)(i + 10) = (char)((uint)*(undefined4 *)(chunk + 0x20) >> 8);
    *(char *)(i + 0xb) = (char)*(undefined4 *)(chunk + 0x20);
    *(char *)(i + 0xc) = (char)((uint)*(undefined4 *)(chunk + 0x24) >> 8);
    *(char *)(i + 0xd) = (char)*(undefined4 *)(chunk + 0x24);
  }
  if (i != 0) {
    lodepng_chunk_generate_crc((uchar *)i);
  }
  return 0;
}

Assistant:

static unsigned addChunk_tRNS(ucvector* out, const LodePNGColorMode* info) {
  unsigned char* chunk = 0;

  if(info->colortype == LCT_PALETTE) {
    size_t i, amount = info->palettesize;
    /*the tail of palette values that all have 255 as alpha, does not have to be encoded*/
    for(i = info->palettesize; i != 0; --i) {
      if(info->palette[4 * (i - 1) + 3] != 255) break;
      --amount;
    }
    if(amount) {
      CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, amount, "tRNS"));
      /*add the alpha channel values from the palette*/
      for(i = 0; i != amount; ++i) chunk[8 + i] = info->palette[4 * i + 3];
    }
  } else if(info->colortype == LCT_GREY) {
    if(info->key_defined) {
      CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 2, "tRNS"));
      chunk[8] = (unsigned char)(info->key_r >> 8);
      chunk[9] = (unsigned char)(info->key_r & 255);
    }
  } else if(info->colortype == LCT_RGB) {
    if(info->key_defined) {
      CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 6, "tRNS"));
      chunk[8] = (unsigned char)(info->key_r >> 8);
      chunk[9] = (unsigned char)(info->key_r & 255);
      chunk[10] = (unsigned char)(info->key_g >> 8);
      chunk[11] = (unsigned char)(info->key_g & 255);
      chunk[12] = (unsigned char)(info->key_b >> 8);
      chunk[13] = (unsigned char)(info->key_b & 255);
    }
  }

  if(chunk) lodepng_chunk_generate_crc(chunk);
  return 0;
}